

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::TryFastAppend
          (SnappyIOVecWriter *this,char *ip,size_t available,size_t len,char **param_5)

{
  ulong in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t space_left;
  undefined1 local_1;
  
  if ((((in_RCX < 0x11) && (0x14 < in_RDX)) &&
      (0xf < (ulong)(*(long *)(in_RDI + 0x28) - *(long *)(in_RDI + 0x20)))) &&
     (0xf < *(ulong *)(in_RDI + 0x18))) {
    anon_unknown_3::UnalignedCopy128(in_RSI,*(void **)(in_RDI + 0x10));
    *(ulong *)(in_RDI + 0x10) = in_RCX + *(long *)(in_RDI + 0x10);
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - in_RCX;
    *(ulong *)(in_RDI + 0x20) = in_RCX + *(long *)(in_RDI + 0x20);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t len,
                            char**) {
    const size_t space_left = output_limit_ - total_written_;
    if (len <= 16 && available >= 16 + kMaximumTagLength && space_left >= 16 &&
        curr_iov_remaining_ >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, curr_iov_output_);
      curr_iov_output_ += len;
      curr_iov_remaining_ -= len;
      total_written_ += len;
      return true;
    }

    return false;
  }